

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O0

void __thiscall
cfdcapi_key_PubkeyTweakConversionTest_Test::TestBody
          (cfdcapi_key_PubkeyTweakConversionTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *str_buffer;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  char *negate;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *tweak_mul;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *tweak_added;
  char *tweak;
  char *pubkey;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffce8;
  AssertionResult *in_stack_fffffffffffffcf0;
  CfdErrorCode *in_stack_fffffffffffffcf8;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  void **in_stack_fffffffffffffd08;
  void *in_stack_fffffffffffffd28;
  char **in_stack_fffffffffffffd80;
  AssertHelper local_210;
  Message local_208;
  undefined4 local_1fc;
  AssertionResult local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  AssertHelper local_198;
  Message local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  char *local_150;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  char **in_stack_fffffffffffffef0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  AssertHelper in_stack_ffffffffffffff08;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffd08);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37efaa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x1cc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x37f00d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f062);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,(type *)0x37f096);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x1cd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x37f192);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f20d);
  local_a0 = "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9";
  local_a8 = "98430d10471cf697e2661e31ceb8720750b59a85374290e175799ba5dd06508e";
  local_b0 = (char *)0x0;
  local_14 = CfdPubkeyTweakAdd(in_stack_ffffffffffffff08.data_,in_stack_ffffffffffffff00,
                               (char *)in_stack_fffffffffffffef8.ptr_,in_stack_fffffffffffffef0);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37f310);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x1d6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x37f373);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f3c8);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_e8,"tweak_added",
               "\"02b05cf99a2f556177a38f5108445472316e87eb4f5b243d79d7e5829d3d53babc\"",local_b0,
               "02b05cf99a2f556177a38f5108445472316e87eb4f5b243d79d7e5829d3d53babc");
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37f477);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x1d8,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff08,&local_f0)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff08);
      testing::Message::~Message((Message *)0x37f4da);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f52f);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  pcVar2 = (char *)0x0;
  local_14 = CfdPubkeyTweakMul(in_stack_ffffffffffffff08.data_,(char *)0x0,
                               (char *)in_stack_fffffffffffffef8.ptr_,in_stack_fffffffffffffef0);
  local_114 = 0;
  pAVar3 = (AssertionResult *)&stack0xfffffffffffffef0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    in_stack_fffffffffffffd80 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x37f623);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x1e2,(char *)in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message((Message *)0x37f686);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f6db);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_138,"tweak_mul",
               "\"0305d10e760a529d0523e98892d2deff59b91593a0d670bd82271cfa627c9e7e18\"",pcVar2,
               "0305d10e760a529d0523e98892d2deff59b91593a0d670bd82271cfa627c9e7e18");
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37f78a);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x1e4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x37f7ed);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f842);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  local_150 = (char *)0x0;
  local_14 = CfdNegatePubkey(in_stack_fffffffffffffe58.ptr_,in_stack_fffffffffffffe50,
                             (char **)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
  ;
  local_164 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37f922);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x1ed,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x37f97f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37f9d4);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_188,"negate",
               "\"02662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9\"",local_150,
               "02662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9");
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37fa77);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x1ef,pcVar2);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x37fad4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37fb29);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffd28);
  if (local_14 != 0) {
    local_14 = CfdGetLastErrorMessage(pAVar3,in_stack_fffffffffffffd80);
    pAVar3 = (AssertionResult *)&stack0xfffffffffffffe50;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd08,
               (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37fc23);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x1f8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message((Message *)0x37fc80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37fcd5);
    testing::internal::CmpHelperSTREQ((internal *)&local_1d8,"\"\"","str_buffer","",(char *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      in_stack_fffffffffffffd08 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x37fd6a);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x1f9,(char *)in_stack_fffffffffffffd08);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message((Message *)0x37fdc7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37fe1c);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffcf8);
  local_1fc = 0;
  pAVar3 = &local_1f8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (CfdErrorCode *)pAVar3,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x37feec);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x1ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message((Message *)0x37ff49);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x37ff9e);
  return;
}

Assistant:

TEST(cfdcapi_key, PubkeyTweakConversionTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  const char* pubkey = "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9";
  const char* tweak = "98430d10471cf697e2661e31ceb8720750b59a85374290e175799ba5dd06508e";

  // test for adding tweak
  {
    char* tweak_added = nullptr;
    ret = CfdPubkeyTweakAdd(handle, pubkey, tweak, &tweak_added);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(tweak_added, "02b05cf99a2f556177a38f5108445472316e87eb4f5b243d79d7e5829d3d53babc");
      CfdFreeStringBuffer(tweak_added);
    }
  }

  // test for multiplying tweak
  {
    char* tweak_mul = nullptr;

    ret = CfdPubkeyTweakMul(handle, pubkey, tweak, &tweak_mul);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(tweak_mul, "0305d10e760a529d0523e98892d2deff59b91593a0d670bd82271cfa627c9e7e18");
      CfdFreeStringBuffer(tweak_mul);
    }
  }

  {
    char* negate = nullptr;

    ret = CfdNegatePubkey(handle, pubkey, &negate);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(negate, "02662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9");
      CfdFreeStringBuffer(negate);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}